

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.h
# Opt level: O0

void __thiscall MeshLib::FaceHalfedgeIterator::operator++(FaceHalfedgeIterator *this)

{
  HalfEdge *pHVar1;
  TopologyException *this_00;
  HalfEdge **ppHVar2;
  FaceHalfedgeIterator *this_local;
  
  if (this->m_halfedge == (tHalfEdge)0x0) {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00,"iterators");
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  ppHVar2 = HalfEdge::he_next(this->m_halfedge);
  this->m_halfedge = *ppHVar2;
  pHVar1 = this->m_halfedge;
  ppHVar2 = Face::halfedge(this->m_face);
  if (pHVar1 == *ppHVar2) {
    this->m_halfedge = (tHalfEdge)0x0;
  }
  return;
}

Assistant:

void operator++()
	{
		if( m_halfedge == NULL ) throw TopologyException("iterators");
		m_halfedge = m_halfedge->he_next();

		if( m_halfedge == m_face->halfedge() )
		{
			 m_halfedge = NULL;
			return;
		};
	}